

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O3

string * __thiscall
pbrt::CompactLightBounds::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CompactLightBounds *this)

{
  anon_struct_4_3_aa976015_for_CompactLightBounds_2 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  undefined1 in_register_00001304 [12];
  Vector3f VVar6;
  uint local_54;
  float local_50;
  uint local_4c;
  float local_48;
  uint local_44;
  Tuple3<pbrt::Vector3,_float> local_40;
  
  auVar5 = in_ZMM0._8_56_;
  VVar6 = OctahedralVector::operator_cast_to_Vector3(&this->w);
  local_40.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  local_40._0_8_ = vmovlps_avx(auVar4._0_16_);
  aVar1 = this->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_4c = (uint)aVar1 >> 0xf & 0x7fff;
  local_54 = (uint)aVar1 >> 0x1e & 1;
  local_44 = (uint)aVar1 & 0x7fff;
  auVar2._0_4_ = (float)local_44 / 32767.0;
  auVar2._4_12_ = in_register_00001304;
  auVar2 = vfmadd213ss_fma(auVar2,SUB6416(ZEXT464(0x40000000),0),SUB6416(ZEXT464(0xbf800000),0));
  local_48 = auVar2._0_4_;
  auVar3._0_4_ = (float)local_4c / 32767.0;
  auVar3._4_12_ = in_register_00001304;
  auVar2 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x40000000),0),SUB6416(ZEXT464(0xbf800000),0));
  local_50 = auVar2._0_4_;
  detail::
  stringPrintfRecursive<unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
            (__return_storage_ptr__,
             "[ CompactLightBounds qb: [ [ %u %u %u ] [ %u %u %u ] ] w: %s (%s) phi: %f qCosTheta_o: %u (%f) qCosTheta_e: %u (%f) twoSided: %u ]"
             ,this->qb[0],this->qb[0] + 1,this->qb[0] + 2,this->qb[1],this->qb[1] + 1,
             this->qb[1] + 2,&this->w,(Vector3<float> *)&local_40,&this->phi,&local_44,&local_48,
             &local_4c,&local_50,&local_54);
  return __return_storage_ptr__;
}

Assistant:

std::string CompactLightBounds::ToString() const {
    return StringPrintf(
        "[ CompactLightBounds qb: [ [ %u %u %u ] [ %u %u %u ] ] w: %s (%s) phi: %f "
        "qCosTheta_o: %u (%f) qCosTheta_e: %u (%f) twoSided: %u ]",
        qb[0][0], qb[0][1], qb[0][2], qb[1][0], qb[1][1], qb[1][2], w, Vector3f(w), phi,
        qCosTheta_o, CosTheta_o(), qCosTheta_e, CosTheta_e(), twoSided);
}